

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry * stumpless_add_element(stumpless_entry *entry,stumpless_element *element)

{
  stumpless_entry *result;
  stumpless_element *element_local;
  stumpless_entry *entry_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else if (element == (stumpless_element *)0x0) {
    raise_argument_empty("element was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    clear_error();
    lock_entry(entry);
    entry_local = locked_add_element(entry,element);
    unlock_entry(entry);
  }
  return entry_local;
}

Assistant:

struct stumpless_entry *
stumpless_add_element( struct stumpless_entry *entry,
                       struct stumpless_element *element ) {
  struct stumpless_entry *result;

  VALIDATE_ARG_NOT_NULL( entry );
  VALIDATE_ARG_NOT_NULL( element );

  clear_error(  );

  lock_entry( entry );
  result = locked_add_element( entry, element );
  unlock_entry( entry );

  return result;
}